

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContext.h
# Opt level: O0

void __thiscall Diligent::DeviceContextDesc::DeviceContextDesc(DeviceContextDesc *this)

{
  DeviceContextDesc *local_18;
  DeviceContextDesc *this_local;
  
  this->Name = (Char *)0x0;
  this->QueueType = COMMAND_QUEUE_TYPE_UNKNOWN;
  this->IsDeferred = false;
  this->ContextId = '\0';
  this->QueueId = 0xff;
  local_18 = (DeviceContextDesc *)this->TextureCopyGranularity;
  do {
    *(Uint32 *)&local_18->Name = 0;
    local_18 = (DeviceContextDesc *)((long)&local_18->Name + 4);
  } while (local_18 != this + 1);
  return;
}

Assistant:

constexpr DeviceContextDesc() noexcept {}